

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  ushort *puVar1;
  u32 uVar2;
  u8 *puVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar8 = (ulong)pPg->hdrOffset;
  puVar3 = pPg->aData;
  uVar4 = *(ushort *)(puVar3 + uVar8 + 1) << 8 | *(ushort *)(puVar3 + uVar8 + 1) >> 8;
  uVar2 = pPg->pBt->usableSize;
  uVar10 = uVar2 - nByte;
  uVar9 = uVar8 + 1;
  while( true ) {
    uVar7 = (ulong)uVar4;
    uVar5 = (uint)uVar4;
    if ((int)uVar10 < (int)uVar5) {
      if ((int)uVar5 <= (int)(uVar2 - 4)) {
        return (u8 *)0x0;
      }
      iVar6 = 0x1107e;
      goto LAB_00175bd1;
    }
    puVar1 = (ushort *)(puVar3 + uVar7);
    uVar11 = (uint)(ushort)(*(ushort *)(puVar3 + uVar7 + 2) << 8 |
                           *(ushort *)(puVar3 + uVar7 + 2) >> 8) - nByte;
    if (-1 < (int)uVar11) break;
    uVar4 = *puVar1 << 8 | *puVar1 >> 8;
    uVar9 = uVar7;
    if (uVar4 <= uVar5) {
      if (uVar4 != 0) {
        iVar6 = 0x11077;
LAB_00175bd1:
        iVar6 = sqlite3CorruptError(iVar6);
        *pRc = iVar6;
      }
      return (u8 *)0x0;
    }
  }
  if (uVar11 < 4) {
    if (0x39 < puVar3[uVar8 + 7]) {
      return (u8 *)0x0;
    }
    *(ushort *)(puVar3 + uVar9) = *puVar1;
    puVar3[uVar8 + 7] = puVar3[uVar8 + 7] + (char)uVar11;
    return (u8 *)puVar1;
  }
  if (uVar5 + uVar11 <= uVar10) {
    puVar1[1] = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
    return puVar3 + (uVar5 + uVar11);
  }
  iVar6 = 0x11068;
  goto LAB_00175bd1;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;            /* Offset to page header */
  u8 * const aData = pPg->aData;             /* Page data */
  int iAddr = hdr + 1;                       /* Address of ptr to pc */
  u8 *pTmp = &aData[iAddr];                  /* Temporary ptr into aData[] */
  int pc = get2byte(pTmp);                   /* Address of a free slot */
  int x;                                     /* Excess size of the slot */
  int maxPC = pPg->pBt->usableSize - nByte;  /* Max address for a usable slot */
  int size;                                  /* Size of the free slot */

  assert( pc>0 );
  while( pc<=maxPC ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    pTmp = &aData[pc+2];
    size = get2byte(pTmp);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
        return &aData[pc];
      }else if( x+pc > maxPC ){
        /* This slot extends off the end of the usable part of the page */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
        ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pTmp = &aData[pc];
    pc = get2byte(pTmp);
    if( pc<=iAddr ){
      if( pc ){
        /* The next slot in the chain comes before the current slot */
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
      }
      return 0;
    }
  }
  if( pc>maxPC+nByte-4 ){
    /* The free slot chain extends off the end of the page */
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }
  return 0;
}